

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall CRPCTable::CRPCTable(CRPCTable *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  CRPCCommand *pcmd;
  long lVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header;
  (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pcmd = vRPCCommands;
  for (lVar3 = 0x200; lVar3 != 0; lVar3 = lVar3 + -0x80) {
    appendCommand(this,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CRPCTable::CRPCTable()
{
    for (const auto& c : vRPCCommands) {
        appendCommand(c.name, &c);
    }
}